

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void __thiscall
nlohmann::detail::
serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::serializer(serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             *this,output_adapter_t<char> *s,char ichar)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  char cVar3;
  lconv *plVar4;
  
  cVar3 = '\0';
  (this->o).
  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (s->
           super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  p_Var2 = (s->
           super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  (s->
  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->o).
  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar1;
  (this->o).
  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  (s->
  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>).
  _M_ptr = (element_type *)0x0;
  (this->number_buffer)._M_elems[0x30] = '\0';
  (this->number_buffer)._M_elems[0x31] = '\0';
  (this->number_buffer)._M_elems[0x32] = '\0';
  (this->number_buffer)._M_elems[0x33] = '\0';
  (this->number_buffer)._M_elems[0x34] = '\0';
  (this->number_buffer)._M_elems[0x35] = '\0';
  (this->number_buffer)._M_elems[0x36] = '\0';
  (this->number_buffer)._M_elems[0x37] = '\0';
  (this->number_buffer)._M_elems[0x38] = '\0';
  (this->number_buffer)._M_elems[0x39] = '\0';
  (this->number_buffer)._M_elems[0x3a] = '\0';
  (this->number_buffer)._M_elems[0x3b] = '\0';
  (this->number_buffer)._M_elems[0x3c] = '\0';
  (this->number_buffer)._M_elems[0x3d] = '\0';
  (this->number_buffer)._M_elems[0x3e] = '\0';
  (this->number_buffer)._M_elems[0x3f] = '\0';
  (this->number_buffer)._M_elems[0x20] = '\0';
  (this->number_buffer)._M_elems[0x21] = '\0';
  (this->number_buffer)._M_elems[0x22] = '\0';
  (this->number_buffer)._M_elems[0x23] = '\0';
  (this->number_buffer)._M_elems[0x24] = '\0';
  (this->number_buffer)._M_elems[0x25] = '\0';
  (this->number_buffer)._M_elems[0x26] = '\0';
  (this->number_buffer)._M_elems[0x27] = '\0';
  (this->number_buffer)._M_elems[0x28] = '\0';
  (this->number_buffer)._M_elems[0x29] = '\0';
  (this->number_buffer)._M_elems[0x2a] = '\0';
  (this->number_buffer)._M_elems[0x2b] = '\0';
  (this->number_buffer)._M_elems[0x2c] = '\0';
  (this->number_buffer)._M_elems[0x2d] = '\0';
  (this->number_buffer)._M_elems[0x2e] = '\0';
  (this->number_buffer)._M_elems[0x2f] = '\0';
  (this->number_buffer)._M_elems[0x10] = '\0';
  (this->number_buffer)._M_elems[0x11] = '\0';
  (this->number_buffer)._M_elems[0x12] = '\0';
  (this->number_buffer)._M_elems[0x13] = '\0';
  (this->number_buffer)._M_elems[0x14] = '\0';
  (this->number_buffer)._M_elems[0x15] = '\0';
  (this->number_buffer)._M_elems[0x16] = '\0';
  (this->number_buffer)._M_elems[0x17] = '\0';
  (this->number_buffer)._M_elems[0x18] = '\0';
  (this->number_buffer)._M_elems[0x19] = '\0';
  (this->number_buffer)._M_elems[0x1a] = '\0';
  (this->number_buffer)._M_elems[0x1b] = '\0';
  (this->number_buffer)._M_elems[0x1c] = '\0';
  (this->number_buffer)._M_elems[0x1d] = '\0';
  (this->number_buffer)._M_elems[0x1e] = '\0';
  (this->number_buffer)._M_elems[0x1f] = '\0';
  (this->number_buffer)._M_elems[0] = '\0';
  (this->number_buffer)._M_elems[1] = '\0';
  (this->number_buffer)._M_elems[2] = '\0';
  (this->number_buffer)._M_elems[3] = '\0';
  (this->number_buffer)._M_elems[4] = '\0';
  (this->number_buffer)._M_elems[5] = '\0';
  (this->number_buffer)._M_elems[6] = '\0';
  (this->number_buffer)._M_elems[7] = '\0';
  (this->number_buffer)._M_elems[8] = '\0';
  (this->number_buffer)._M_elems[9] = '\0';
  (this->number_buffer)._M_elems[10] = '\0';
  (this->number_buffer)._M_elems[0xb] = '\0';
  (this->number_buffer)._M_elems[0xc] = '\0';
  (this->number_buffer)._M_elems[0xd] = '\0';
  (this->number_buffer)._M_elems[0xe] = '\0';
  (this->number_buffer)._M_elems[0xf] = '\0';
  plVar4 = localeconv();
  this->loc = (lconv *)plVar4;
  if (plVar4->thousands_sep != (char *)0x0) {
    cVar3 = *plVar4->thousands_sep;
  }
  this->thousands_sep = cVar3;
  if (plVar4->decimal_point == (char *)0x0) {
    cVar3 = '\0';
  }
  else {
    cVar3 = *plVar4->decimal_point;
  }
  this->decimal_point = cVar3;
  this->indent_char = ichar;
  (this->indent_string)._M_dataplus._M_p = (pointer)&(this->indent_string).field_2;
  std::__cxx11::string::_M_construct((ulong)&this->indent_string,'\0');
  return;
}

Assistant:

serializer(output_adapter_t<char> s, const char ichar)
        : o(std::move(s)), loc(std::localeconv()),
          thousands_sep(loc->thousands_sep == nullptr ? '\0' : * (loc->thousands_sep)),
          decimal_point(loc->decimal_point == nullptr ? '\0' : * (loc->decimal_point)),
          indent_char(ichar), indent_string(512, indent_char) {}